

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O3

void __thiscall
jaegertracing::Span::
doLog<std::vector<std::pair<opentracing::v3::string_view,opentracing::v3::Value>,std::allocator<std::pair<opentracing::v3::string_view,opentracing::v3::Value>>>>
          (Span *this,SystemTime timestamp,
          vector<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>,_std::allocator<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>_>_>
          *fieldPairs)

{
  int iVar1;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> fields;
  time_point local_40;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_38;
  
  local_40.__d.__r = timestamp.__d.__r;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar1 == 0) {
    if (((this->_context)._flags & 1) != 0) {
      local_38.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_start = (Tag *)0x0;
      local_38.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_finish = (Tag *)0x0;
      local_38.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::reserve
                (&local_38,
                 ((long)(fieldPairs->
                        super__Vector_base<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>,_std::allocator<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(fieldPairs->
                        super__Vector_base<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>,_std::allocator<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
      std::
      transform<__gnu_cxx::__normal_iterator<std::pair<opentracing::v3::string_view,opentracing::v3::Value>*,std::vector<std::pair<opentracing::v3::string_view,opentracing::v3::Value>,std::allocator<std::pair<opentracing::v3::string_view,opentracing::v3::Value>>>>,std::back_insert_iterator<std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,jaegertracing::Span::doLog<std::vector<std::pair<opentracing::v3::string_view,opentracing::v3::Value>,std::allocator<std::pair<opentracing::v3::string_view,opentracing::v3::Value>>>>(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::vector<std::pair<opentracing::v3::string_view,opentracing::v3::Value>,std::allocator<std::pair<opentracing::v3::string_view,opentracing::v3::Value>>>)::_lambda(std::pair<opentracing::v3::string_view,opentracing::v3::Value>const&)_1_>
                ((fieldPairs->
                 super__Vector_base<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>,_std::allocator<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (fieldPairs->
                 super__Vector_base<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>,_std::allocator<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,&local_38);
      logFieldsNoLocking<__gnu_cxx::__normal_iterator<jaegertracing::Tag*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>>
                (this,&local_40,
                 (__normal_iterator<jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
                  )local_38.
                   super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
                  )local_38.
                   super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_38);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void doLog(opentracing::SystemTime timestamp, Container fieldPairs) noexcept
    {
        std::lock_guard<std::mutex> lock(_mutex);
        if (!_context.isSampled()) {
            return;
        }

        std::vector<Tag> fields;
        fields.reserve(fieldPairs.size());
        std::transform(
            std::begin(fieldPairs),
            std::end(fieldPairs),
            std::back_inserter(fields),
            [](const std::pair<opentracing::string_view, opentracing::Value>&
                   pair) { return Tag(pair.first, pair.second); });
        logFieldsNoLocking(timestamp, std::begin(fields), std::end(fields));
    }